

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

locate_result * __thiscall
boost::runtime::cla::parser::locate_parameter
          (locate_result *__return_storage_ptr__,parser *this,trie_ptr *curr_trie,cstring *name,
          cstring *token)

{
  _Base_ptr p_Var1;
  element_type *peVar2;
  pointer prVar3;
  reference_wrapper<const_boost::runtime::parameter_cla_id> rVar4;
  pointer psVar5;
  pointer psVar6;
  pointer psVar7;
  pointer psVar8;
  pointer psVar9;
  element_type *peVar10;
  locate_result *plVar11;
  undefined1 auVar12 [8];
  shared_count sVar13;
  pointer psVar14;
  pointer psVar15;
  pointer psVar16;
  pointer psVar17;
  pointer psVar18;
  _Base_ptr p_Var19;
  pointer psVar20;
  pointer prVar21;
  pair<std::_Rb_tree_iterator<const_boost::runtime::parameter_cla_id_*>,_bool> pVar22;
  trie_ptr typo_cand;
  vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  typo_candidate_names;
  set<const_boost::runtime::parameter_cla_id_*,_std::less<const_boost::runtime::parameter_cla_id_*>,_std::allocator<const_boost::runtime::parameter_cla_id_*>_>
  unique_typo_candidate;
  trie_ptr next_typo_cand;
  vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  local_1f8;
  shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> local_1d8;
  pointer local_1c0;
  vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  local_1b8;
  ambiguous_param local_198;
  cstring *local_140;
  vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  local_138;
  undefined8 local_118;
  ulong uStack_110;
  undefined8 local_108;
  ulong *local_100;
  ulong *local_f8;
  undefined8 local_f0;
  locate_result *local_e0;
  pointer local_d8;
  undefined1 local_d0 [8];
  shared_count asStack_c8 [9];
  undefined **local_80;
  char *local_78;
  char *local_70;
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  pointer local_48;
  pointer pbStack_40;
  pointer local_38;
  
  local_1f8.
  super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.
  super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.
  super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8.
  super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.
  super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.px = (element_type *)0x0;
  local_1d8.pn.pi_ = (sp_counted_base *)0x0;
  psVar20 = (pointer)name->m_begin;
  local_1c0 = (pointer)name->m_end;
  local_140 = token;
  local_e0 = __return_storage_ptr__;
  if (psVar20 != local_1c0) {
    do {
      psVar9 = local_1f8.
               super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      psVar5 = local_1f8.
               super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar6 = local_1f8.
               super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar7 = local_1f8.
               super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (curr_trie->px == (element_type *)0x0) {
        for (; psVar8 = psVar6, psVar15 = psVar6, psVar16 = psVar7, psVar14 = psVar7,
            psVar17 = local_1f8.
                      super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
            local_1f8.
            super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_1b8.
                 super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
            local_1f8.
            super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_1b8.
                 super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
            psVar18 = local_1b8.
                      super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage, psVar5 != psVar9;
            psVar5 = psVar5 + 1) {
          local_198.
          super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
          super_input_error.super_param_error._0_8_ = psVar5->px;
          local_198.
          super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
          super_input_error.super_param_error.param_name.m_begin = (iterator)(psVar5->pn).pi_;
          if ((sp_counted_base *)
              local_198.
              super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
              .super_input_error.super_param_error.param_name.m_begin != (sp_counted_base *)0x0) {
            LOCK();
            ((sp_counted_base *)
            local_198.
            super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
            .super_input_error.super_param_error.param_name.m_begin)->use_count_ =
                 ((sp_counted_base *)
                 local_198.
                 super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
                 .super_input_error.super_param_error.param_name.m_begin)->use_count_ + 1;
            UNLOCK();
          }
          local_1f8.
          super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
          ._M_impl.super__Vector_impl_data._M_start = psVar6;
          local_1f8.
          super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = psVar7;
          if ((parameter_cla_id *)
              local_198.
              super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
              .super_input_error.super_param_error._0_8_ == (parameter_cla_id *)0x0)
          goto LAB_0018f927;
          rt_cla_detail::parameter_trie::get_subtrie
                    ((parameter_trie *)local_d0,
                     (char)local_198.
                           super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
                           .super_input_error.super_param_error._0_8_);
          if (local_d0 != (undefined1  [8])0x0) {
            std::
            vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
            ::push_back(&local_1b8,(value_type *)local_d0);
          }
          detail::shared_count::~shared_count(asStack_c8);
          detail::shared_count::~shared_count
                    ((shared_count *)
                     &local_198.
                      super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
                      .super_input_error.super_param_error.param_name);
          psVar6 = local_1f8.
                   super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          psVar7 = local_1f8.
                   super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; local_1f8.
               super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar18,
            local_1b8.
            super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar17,
            local_1b8.
            super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = psVar16,
            local_1b8.
            super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
            ._M_impl.super__Vector_impl_data._M_start = psVar15, psVar7 != psVar8;
            psVar8 = (pointer)((long)psVar8 + 0x10)) {
          detail::shared_count::~shared_count((shared_count *)((long)psVar8 + 8));
          psVar15 = local_1b8.
                    super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar16 = local_1b8.
                    super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          psVar14 = psVar6;
          psVar17 = local_1b8.
                    super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          psVar18 = local_1f8.
                    super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        }
      }
      else {
        rt_cla_detail::parameter_trie::get_subtrie((parameter_trie *)local_d0,(char)curr_trie->px);
        sVar13.pi_ = asStack_c8[0].pi_;
        auVar12 = local_d0;
        local_198.
        super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
        super_input_error.super_param_error.param_name.m_begin = (iterator)local_1d8.pn.pi_;
        local_198.
        super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
        super_input_error.super_param_error._0_8_ = local_1d8.px;
        local_d0 = (undefined1  [8])0x0;
        asStack_c8[0].pi_ = (sp_counted_base *)0x0;
        local_1d8.px = (element_type *)auVar12;
        local_1d8.pn.pi_ = sVar13.pi_;
        detail::shared_count::~shared_count
                  ((shared_count *)
                   &local_198.
                    super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
                    .super_input_error.super_param_error.param_name);
        detail::shared_count::~shared_count(asStack_c8);
        if ((parameter_cla_id *)local_1d8.px == (parameter_cla_id *)0x0) {
          peVar2 = curr_trie->px;
          local_d8 = psVar20;
          if ((peVar2 == (element_type *)0x0) || (curr_trie->px == (element_type *)0x0))
          goto LAB_0018f927;
          p_Var19 = (peVar2->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          while ((_Rb_tree_header *)p_Var19 !=
                 &(peVar2->m_subtrie)._M_t._M_impl.super__Rb_tree_header) {
            std::
            vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
            ::push_back(&local_1f8,(value_type *)&p_Var19[1]._M_parent);
            p_Var1 = p_Var19[1]._M_parent;
            if (p_Var1 == (_Base_ptr)0x0) goto LAB_0018f927;
            rt_cla_detail::parameter_trie::get_subtrie((parameter_trie *)local_d0,(char)p_Var1);
            sVar13.pi_ = asStack_c8[0].pi_;
            auVar12 = local_d0;
            local_198.
            super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
            .super_input_error.super_param_error.param_name.m_begin = (iterator)local_1d8.pn.pi_;
            local_198.
            super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
            .super_input_error.super_param_error._0_8_ = local_1d8.px;
            local_d0 = (undefined1  [8])0x0;
            asStack_c8[0].pi_ = (sp_counted_base *)0x0;
            local_1d8.px = (element_type *)auVar12;
            local_1d8.pn.pi_ = sVar13.pi_;
            detail::shared_count::~shared_count
                      ((shared_count *)
                       &local_198.
                        super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
                        .super_input_error.super_param_error.param_name);
            peVar10 = local_1d8.px;
            detail::shared_count::~shared_count(asStack_c8);
            if ((parameter_cla_id *)peVar10 != (parameter_cla_id *)0x0) {
              std::
              vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
              ::push_back(&local_1f8,&local_1d8);
            }
            if ((curr_trie->px == (element_type *)0x0) ||
               (p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19),
               curr_trie->px == (element_type *)0x0)) goto LAB_0018f927;
          }
          std::
          vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
          ::push_back(&local_1f8,curr_trie);
          local_198.
          super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
          super_input_error.super_param_error._0_8_ = curr_trie->px;
          local_198.
          super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
          super_input_error.super_param_error.param_name.m_begin = (iterator)(curr_trie->pn).pi_;
          curr_trie->px = (element_type *)0x0;
          (curr_trie->pn).pi_ = (sp_counted_base *)0x0;
          detail::shared_count::~shared_count
                    ((shared_count *)
                     &local_198.
                      super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
                      .super_input_error.super_param_error.param_name);
          psVar20 = local_d8;
          psVar14 = local_1b8.
                    super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator=
                    (curr_trie,&local_1d8);
          psVar14 = local_1b8.
                    super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      local_1b8.
      super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar14;
      psVar20 = (pointer)((long)&psVar20->px + 1);
    } while (psVar20 != local_1c0);
  }
  plVar11 = local_e0;
  peVar2 = curr_trie->px;
  if (peVar2 != (element_type *)0x0) {
    prVar21 = (peVar2->m_id_candidates).
              super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    prVar3 = (peVar2->m_id_candidates).
             super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)prVar3 - (long)prVar21) < 9) {
      std::pair<boost::runtime::parameter_cla_id,_boost::shared_ptr<boost::runtime::basic_param>_>::
      pair<boost::shared_ptr<boost::runtime::basic_param>_&,_true>
                (local_e0,prVar3[-1].t_,&peVar2->m_param_candidate);
      detail::shared_count::~shared_count(&local_1d8.pn);
      std::
      vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
      ::~vector(&local_1b8);
      std::
      vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
      ::~vector(&local_1f8);
      return plVar11;
    }
    local_118 = 0;
    uStack_110 = 0;
    local_108 = 0;
    if (curr_trie->px != (element_type *)0x0) {
      do {
        if (prVar21 == prVar3) {
          local_68._M_p = (pointer)&local_58;
          local_78 = "";
          local_70 = "";
          local_60 = 0;
          local_58._M_local_buf[0] = '\0';
          local_80 = &PTR__ambiguous_param_001cce88;
          local_48 = (pointer)local_118;
          pbStack_40 = (pointer)uStack_110;
          local_38 = (pointer)local_108;
          local_118 = 0;
          uStack_110 = 0;
          local_108 = 0;
          specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>::
          operator<<((ambiguous_param *)local_d0,
                     (specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
                      *)&local_80,"An ambiguous parameter name in the argument ");
          specific_param_error<boost::runtime::ambiguous_param,boost::runtime::input_error>::
          operator<<(&local_198,
                     (specific_param_error<boost::runtime::ambiguous_param,boost::runtime::input_error>
                      *)local_d0,local_140);
          unit_test::ut_detail::throw_exception<boost::runtime::ambiguous_param>(&local_198);
        }
        local_198.
        super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
        super_input_error.super_param_error._0_8_ = (prVar21->t_->m_tag)._M_dataplus._M_p;
        local_198.
        super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
        super_input_error.super_param_error.param_name.m_begin =
             (iterator)
             ((long)&(((trie_per_char *)
                      &((parameter_cla_id *)
                       local_198.
                       super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
                       .super_input_error.super_param_error._0_8_)->m_prefix)->_M_t)._M_impl.
                     field_0x0 + (prVar21->t_->m_tag)._M_string_length);
        std::
        vector<boost::unit_test::basic_cstring<char_const>,std::allocator<boost::unit_test::basic_cstring<char_const>>>
        ::emplace_back<boost::unit_test::basic_cstring<char_const>>
                  ((vector<boost::unit_test::basic_cstring<char_const>,std::allocator<boost::unit_test::basic_cstring<char_const>>>
                    *)&local_118,(basic_cstring<const_char> *)&local_198);
      } while ((curr_trie->px != (element_type *)0x0) &&
              (prVar21 = prVar21 + 1, curr_trie->px != (element_type *)0x0));
    }
LAB_0018f927:
    __assert_fail("px != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/smart_ptr/shared_ptr.hpp"
                  ,0x2de,
                  "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->() const [T = boost::runtime::cla::rt_cla_detail::parameter_trie]"
                 );
  }
  local_138.
  super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100 = &uStack_110;
  uStack_110 = uStack_110 & 0xffffffff00000000;
  local_108 = 0;
  local_f0 = 0;
  local_f8 = local_100;
  std::
  vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  ::reserve(&local_138,
            (long)local_1f8.
                  super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_1f8.
                  super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4);
  local_1c0 = local_1f8.
              super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1f8.
      super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1f8.
      super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar20 = local_1f8.
              super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_198.
      super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
      super_input_error.super_param_error._0_8_ = psVar20->px;
      local_198.
      super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
      super_input_error.super_param_error.param_name.m_begin = (iterator)(psVar20->pn).pi_;
      if ((sp_counted_base *)
          local_198.
          super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
          super_input_error.super_param_error.param_name.m_begin != (sp_counted_base *)0x0) {
        LOCK();
        ((sp_counted_base *)
        local_198.
        super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
        super_input_error.super_param_error.param_name.m_begin)->use_count_ =
             ((sp_counted_base *)
             local_198.
             super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
             .super_input_error.super_param_error.param_name.m_begin)->use_count_ + 1;
        UNLOCK();
      }
      if ((element_type *)
          local_198.
          super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
          super_input_error.super_param_error._0_8_ == (element_type *)0x0) goto LAB_0018f927;
      prVar21 = *(pointer *)
                 &((param_cla_id_list *)
                  ((long)&((parameter_cla_id *)
                          local_198.
                          super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
                          .super_input_error.super_param_error._0_8_)->m_tag + 0x10))->
                  super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
      ;
      prVar3 = *(pointer *)
                &((param_cla_id_list *)
                 ((long)&((parameter_cla_id *)
                         local_198.
                         super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
                         .super_input_error.super_param_error._0_8_)->m_tag + 0x18))->
                 super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
      ;
      if ((ulong)((long)prVar3 - (long)prVar21) < 9) {
        while( true ) {
          if ((parameter_cla_id *)
              local_198.
              super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
              .super_input_error.super_param_error._0_8_ == (parameter_cla_id *)0x0)
          goto LAB_0018f927;
          if (prVar21 == prVar3) break;
          rVar4.t_ = prVar21->t_;
          local_d0 = (undefined1  [8])rVar4.t_;
          pVar22 = std::
                   _Rb_tree<boost::runtime::parameter_cla_id_const*,boost::runtime::parameter_cla_id_const*,std::_Identity<boost::runtime::parameter_cla_id_const*>,std::less<boost::runtime::parameter_cla_id_const*>,std::allocator<boost::runtime::parameter_cla_id_const*>>
                   ::_M_insert_unique<boost::runtime::parameter_cla_id_const*>
                             ((_Rb_tree<boost::runtime::parameter_cla_id_const*,boost::runtime::parameter_cla_id_const*,std::_Identity<boost::runtime::parameter_cla_id_const*>,std::less<boost::runtime::parameter_cla_id_const*>,std::allocator<boost::runtime::parameter_cla_id_const*>>
                               *)&local_118,(parameter_cla_id **)local_d0);
          if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_d0 = *(undefined1 (*) [8])&((trie_per_char *)&(rVar4.t_)->m_tag)->_M_t;
            asStack_c8[0].pi_ =
                 (sp_counted_base *)
                 ((long)&(((trie_per_char *)&((parameter_cla_id *)local_d0)->m_prefix)->_M_t).
                         _M_impl.field_0x0 +
                 *(size_t *)&((trie_per_char *)((long)&(rVar4.t_)->m_tag + 8))->_M_t);
            std::
            vector<boost::unit_test::basic_cstring<char_const>,std::allocator<boost::unit_test::basic_cstring<char_const>>>
            ::emplace_back<boost::unit_test::basic_cstring<char_const>>
                      ((vector<boost::unit_test::basic_cstring<char_const>,std::allocator<boost::unit_test::basic_cstring<char_const>>>
                        *)&local_138,(basic_cstring<const_char> *)local_d0);
          }
          if ((parameter_cla_id *)
              local_198.
              super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
              .super_input_error.super_param_error._0_8_ == (parameter_cla_id *)0x0)
          goto LAB_0018f927;
          prVar21 = prVar21 + 1;
        }
      }
      detail::shared_count::~shared_count
                ((shared_count *)
                 &local_198.
                  super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
                  .super_input_error.super_param_error.param_name);
      psVar20 = psVar20 + 1;
    } while (psVar20 != local_1c0);
  }
  local_68._M_p = (pointer)&local_58;
  local_78 = "";
  local_70 = "";
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  local_80 = &PTR__unrecognized_param_001cce60;
  local_48 = local_138.
             super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pbStack_40 = local_138.
               super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = local_138.
             super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_138.
  super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>::operator<<
            ((unrecognized_param *)local_d0,
             (specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>
              *)&local_80,"An unrecognized parameter in the argument ");
  specific_param_error<boost::runtime::unrecognized_param,boost::runtime::input_error>::operator<<
            ((unrecognized_param *)&local_198,
             (specific_param_error<boost::runtime::unrecognized_param,boost::runtime::input_error> *
             )local_d0,local_140);
  unit_test::ut_detail::throw_exception<boost::runtime::unrecognized_param>
            ((unrecognized_param *)&local_198);
}

Assistant:

locate_result
    locate_parameter( trie_ptr curr_trie, cstring name, cstring token )
    {
        std::vector<trie_ptr> typo_candidates;
        std::vector<trie_ptr> next_typo_candidates;
        trie_ptr next_trie;

        BOOST_TEST_FOREACH( char, c, name ) {
            if( curr_trie ) {
                // locate next subtrie corresponding to the char
                next_trie = curr_trie->get_subtrie( c );

                if( next_trie )
                    curr_trie = next_trie;
                else {
                    // Initiate search for typo candicates. We will account for 'wrong char' typo
                    // 'missing char' typo and 'extra char' typo
                    BOOST_TEST_FOREACH( trie_per_char::value_type const&, typo_cand, curr_trie->m_subtrie ) {
                        // 'wrong char' typo
                        typo_candidates.push_back( typo_cand.second );

                        // 'missing char' typo
                        if( (next_trie = typo_cand.second->get_subtrie( c )) )
                            typo_candidates.push_back( next_trie );
                    }

                    // 'extra char' typo
                    typo_candidates.push_back( curr_trie );

                    curr_trie.reset();
                }
            }
            else {
                // go over existing typo candidates and see if they are still viable
                BOOST_TEST_FOREACH( trie_ptr, typo_cand, typo_candidates ) {
                    trie_ptr next_typo_cand = typo_cand->get_subtrie( c );

                    if( next_typo_cand )
                        next_typo_candidates.push_back( next_typo_cand );
                }

                next_typo_candidates.swap( typo_candidates );
                next_typo_candidates.clear();
            }
        }

        if( !curr_trie ) {
            std::vector<cstring> typo_candidate_names;
            std::set<parameter_cla_id const*> unique_typo_candidate; // !! ?? unordered_set
            typo_candidate_names.reserve( typo_candidates.size() );
// !! ??            unique_typo_candidate.reserve( typo_candidates.size() );

            BOOST_TEST_FOREACH( trie_ptr, trie_cand, typo_candidates ) {
                // avoid ambiguos candidate trie
                if( trie_cand->m_id_candidates.size() > 1 )
                    continue;

                BOOST_TEST_FOREACH( parameter_cla_id const&, param_cand, trie_cand->m_id_candidates ) {
                    if( !unique_typo_candidate.insert( &param_cand ).second )
                        continue;

                    typo_candidate_names.push_back( param_cand.m_tag );
                }
            }

#ifndef BOOST_NO_CXX11_RVALUE_REFERENCES
            BOOST_TEST_I_THROW( unrecognized_param( std::move(typo_candidate_names) )
                                << "An unrecognized parameter in the argument "
                                << token );
#else
            BOOST_TEST_I_THROW( unrecognized_param( typo_candidate_names )
                                << "An unrecognized parameter in the argument "
                                << token );
#endif
        }

        if( curr_trie->m_id_candidates.size() > 1 ) {
            std::vector<cstring> amb_names;
            BOOST_TEST_FOREACH( parameter_cla_id const&, param_id, curr_trie->m_id_candidates )
                amb_names.push_back( param_id.m_tag );

#ifndef BOOST_NO_CXX11_RVALUE_REFERENCES
            BOOST_TEST_I_THROW( ambiguous_param( std::move( amb_names ) )
                                << "An ambiguous parameter name in the argument " << token );
#else
            BOOST_TEST_I_THROW( ambiguous_param( amb_names )
                                << "An ambiguous parameter name in the argument " << token );
#endif
        }

        return locate_result( curr_trie->m_id_candidates.back().get(), curr_trie->m_param_candidate );
    }